

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

Bridges * __thiscall
Graph::random_bridges_search(Bridges *__return_storage_ptr__,Graph *this,bool recursive)

{
  pointer pEVar1;
  undefined7 in_register_00000011;
  Edge *e;
  pointer __args;
  
  clear(this);
  if ((int)CONCAT71(in_register_00000011,recursive) == 0) {
    dfsForRandomIterative(this);
  }
  else {
    dfsForRandomRecursive(this,0);
  }
  __args = (this->edges).super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar1 = (this->edges).super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__args != pEVar1) {
    do {
      if (__args->shift == 0) {
        std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>::
        emplace_back<unsigned_long&,unsigned_long&>
                  ((vector<Graph::LightEdge,std::allocator<Graph::LightEdge>> *)&this->bridges,
                   (unsigned_long *)__args,&(__args->super_LightEdge).v);
      }
      __args = __args + 1;
    } while (__args != pEVar1);
  }
  std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>::vector
            (__return_storage_ptr__,&this->bridges);
  return __return_storage_ptr__;
}

Assistant:

Graph::Bridges Graph::random_bridges_search(bool recursive) {
    clear();
    if (recursive)
        dfsForRandomRecursive(0);
    else
        dfsForRandomIterative();

    for (auto &e : edges)
        if (e.shift == 0)
            bridges.emplace_back(e.u, e.v);

    return bridges;
}